

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.cpp
# Opt level: O1

Node256 * duckdb::Node256::GrowNode48(ART *art,Node *node256,Node *node48)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var3;
  idx_t iVar4;
  type paVar5;
  long *plVar6;
  pointer this;
  data_ptr_t pdVar7;
  Node256 *pNVar8;
  __hash_code __code;
  ulong uVar9;
  long *plVar10;
  long lVar11;
  
  uVar2 = (node48->super_IndexPointer).data;
  paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var3._M_head_impl =
       paVar5->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  uVar9 = uVar2 & 0xffffffff;
  plVar6 = *(long **)(*(long *)&((_Var3._M_head_impl)->buffers)._M_h +
                     (uVar9 % *(size_type *)((long)&(_Var3._M_head_impl)->buffers + 8)) * 8);
  for (plVar10 = (long *)*plVar6; uVar9 != plVar10[1]; plVar10 = (long *)*plVar10) {
    plVar6 = plVar10;
  }
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)(*plVar6 + 0x10));
  pdVar7 = FixedSizeBuffer::Get(this,true);
  lVar11 = (ulong)((uint)(uVar2 >> 0x20) & 0xffffff) * (_Var3._M_head_impl)->segment_size;
  iVar4 = (_Var3._M_head_impl)->bitmask_offset;
  pdVar1 = pdVar7 + iVar4 + lVar11;
  pNVar8 = New(art,node256);
  (node256->super_IndexPointer).data =
       (node48->super_IndexPointer).data & 0x8000000000000000 |
       (node256->super_IndexPointer).data & 0x7fffffffffffffff;
  pNVar8->count = (ushort)pdVar7[iVar4 + lVar11];
  lVar11 = 1;
  do {
    if ((ulong)pdVar1[lVar11] == 0x30) {
      pNVar8->children[lVar11 + -1].super_IndexPointer.data = 0;
    }
    else {
      pNVar8->children[lVar11 + -1].super_IndexPointer.data =
           *(idx_t *)(pdVar1 + (ulong)pdVar1[lVar11] * 8 + 0x108);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x101);
  *pdVar1 = '\0';
  Node::Free(art,node48);
  return pNVar8;
}

Assistant:

Node256 &Node256::GrowNode48(ART &art, Node &node256, Node &node48) {
	auto &n48 = Node::Ref<Node48>(art, node48, NType::NODE_48);
	auto &n256 = New(art, node256);
	node256.SetGateStatus(node48.GetGateStatus());

	n256.count = n48.count;
	for (uint16_t i = 0; i < CAPACITY; i++) {
		if (n48.child_index[i] != Node48::EMPTY_MARKER) {
			n256.children[i] = n48.children[n48.child_index[i]];
		} else {
			n256.children[i].Clear();
		}
	}

	n48.count = 0;
	Node::Free(art, node48);
	return n256;
}